

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O0

void __thiscall CNscPStackEntry::PushConstantLocation(CNscPStackEntry *this,int nValue)

{
  long *plVar1;
  undefined4 in_ESI;
  long in_RDI;
  NscPCodeConstantInteger *p;
  size_t nSize;
  long lVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar2 = 0x18;
  MakeRoom((CNscPStackEntry *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),0x18);
  plVar1 = (long *)(*(long *)(in_RDI + 0x70) + *(long *)(in_RDI + 0x78));
  *plVar1 = lVar2;
  *(undefined4 *)(plVar1 + 1) = 0x34;
  *(undefined4 *)((long)plVar1 + 0xc) = 0x12;
  *(undefined4 *)(plVar1 + 2) = in_ESI;
  *(long *)(in_RDI + 0x78) = lVar2 + *(long *)(in_RDI + 0x78);
  return;
}

Assistant:

void CNscPStackEntry::PushConstantLocation (int nValue)
{

	//
	// Make room for the pcode block
	//

	size_t nSize = sizeof (NscPCodeConstantInteger);
	MakeRoom (nSize);

	//
	// Initialize the block
	//

	NscPCodeConstantInteger *p = (NscPCodeConstantInteger *) 
		&m_pauchData [m_nDataSize];
	p ->nOpSize = nSize;
	p ->nOpCode = NscPCode_Constant;
	p ->nType = NscType_Engine_2;
	p ->lValue = nValue;

	//
	// Adjust the size of the entry
	//

	m_nDataSize += nSize;
}